

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int64_t motion_mode_rd(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,BLOCK_SIZE bsize,
                      RD_STATS *rd_stats,RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,
                      HandleInterModeArgs *args,int64_t ref_best_rd,int64_t *ref_skip_rd,
                      int *rate_mv,BUFFER_SET *orig_dst,int64_t *best_est_rd,int do_tx_search,
                      InterModesInfo *inter_modes_info,int eval_motion_mode,int64_t *yrd)

{
  undefined1 uVar1;
  uint16_t *puVar2;
  tran_low_t *ptVar3;
  tran_low_t *ptVar4;
  BUFFER_SET dst;
  BUFFER_SET dst_00;
  TileDataEnc *pTVar5;
  byte bVar6;
  uint8_t uVar7;
  InterpFilter IVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  BLOCK_SIZE in_CL;
  long in_RDX;
  AV1_COMP *in_RDI;
  RD_STATS *in_R8;
  int *in_R9;
  uint uVar13;
  RD_STATS *in_stack_00000008;
  long in_stack_00000010;
  int64_t *in_stack_00000018;
  undefined8 *in_stack_00000020;
  int *in_stack_00000028;
  MACROBLOCK *in_stack_00000030;
  long *in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000050;
  long *in_stack_00000058;
  int64_t tmp_rd;
  int64_t curr_rd;
  int y_rate;
  int skip_ctx;
  int mode_rate_1;
  int eval_txfm;
  int64_t curr_sse_1;
  int64_t sse_y_1;
  int64_t skip_rdy;
  int64_t skip_rd;
  int mode_rate;
  int has_est_rd;
  int64_t est_rd;
  int64_t est_dist;
  int est_residue_cost;
  int64_t sse_y;
  int64_t curr_sse;
  int64_t this_yrd;
  ModeCosts *mode_costs;
  int ret;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  int_mv ref_mv;
  int num_proj_ref0;
  WarpedMotionParams wm_params0;
  int_mv mv0;
  int pts_inref [16];
  int pts [16];
  uint32_t cur_mv;
  int prune_obmc;
  int use_actual_frame_probs;
  FRAME_UPDATE_TYPE update_type;
  int tmp_rate_mv;
  int is_interintra_mode;
  int tmp_rate2;
  int mode_index;
  int txfm_rd_gate_level;
  int mode_index_end;
  int mode_index_start;
  int mi_col;
  int mi_row;
  int best_rate_mv;
  int64_t best_rd;
  int switchable_rate;
  int interp_filter;
  MB_MODE_INFO best_mbmi;
  MB_MODE_INFO base_mbmi;
  int total_samples;
  MOTION_MODE last_motion_mode_allowed;
  MV_REFERENCE_FRAME ref_frame_1;
  int *pts_inref0;
  int *pts0;
  WARP_SAMPLE_INFO *warp_sample_info;
  int interintra_allowed;
  int rate_mv0;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  RD_STATS best_rd_stats_uv;
  RD_STATS best_rd_stats_y;
  RD_STATS best_rd_stats;
  int best_xskip_txfm;
  int rate2_nocoeff;
  PREDICTION_MODE this_mode;
  int is_comp_pred;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int num_planes;
  TxfmSearchInfo *txfm_info;
  FeatureFlags *features;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffff298;
  undefined4 uVar14;
  undefined4 uVar15;
  uint uVar16;
  undefined4 in_stack_fffffffffffff29c;
  undefined4 uVar17;
  int *skip_rd_00;
  undefined4 in_stack_fffffffffffff2a0;
  undefined4 in_stack_fffffffffffff2a4;
  MB_MODE_INFO *mbmi_00;
  undefined4 uVar18;
  int residue_cost;
  int_interpfilters in_stack_fffffffffffff2a8;
  undefined4 in_stack_fffffffffffff2ac;
  undefined4 in_stack_fffffffffffff2b0;
  undefined4 in_stack_fffffffffffff2b4;
  MACROBLOCK *x_00;
  int in_stack_fffffffffffff2b8;
  int in_stack_fffffffffffff2bc;
  InterModesInfo *in_stack_fffffffffffff2c0;
  AV1_COMMON *in_stack_fffffffffffff2c8;
  int in_stack_fffffffffffff2d0;
  undefined4 in_stack_fffffffffffff2d4;
  TileDataEnc *in_stack_fffffffffffff2d8;
  int in_stack_fffffffffffff2e0;
  int in_stack_fffffffffffff2e4;
  AV1_COMP *in_stack_fffffffffffff2e8;
  AV1_COMP *in_stack_fffffffffffff2f0;
  int in_stack_fffffffffffff300;
  int_interpfilters in_stack_fffffffffffff308;
  MACROBLOCKD *in_stack_fffffffffffff320;
  int in_stack_fffffffffffff328;
  int_interpfilters in_stack_fffffffffffff32c;
  MACROBLOCK *in_stack_fffffffffffff330;
  BLOCK_SIZE in_stack_fffffffffffff33f;
  uint in_stack_fffffffffffff344;
  uint uVar19;
  undefined4 in_stack_fffffffffffff350;
  int_interpfilters in_stack_fffffffffffff354;
  int64_t *in_stack_fffffffffffff358;
  int in_stack_fffffffffffff360;
  int in_stack_fffffffffffff364;
  int in_stack_fffffffffffff368;
  int in_stack_fffffffffffff36c;
  MACROBLOCKD *in_stack_fffffffffffff370;
  AV1_COMMON *in_stack_fffffffffffff378;
  MACROBLOCK *in_stack_fffffffffffff380;
  AV1_COMP *cpi_00;
  long in_stack_fffffffffffff3a0;
  int_mv in_stack_fffffffffffff3a8;
  int_mv in_stack_fffffffffffff3ac;
  ulong local_c50;
  int *in_stack_fffffffffffff3b8;
  int *in_stack_fffffffffffff3c0;
  tran_low_t *in_stack_fffffffffffff3c8;
  int32_t in_stack_fffffffffffff3d0;
  int in_stack_fffffffffffff3d4;
  AV1_COMMON *in_stack_fffffffffffff3d8;
  MACROBLOCKD *in_stack_fffffffffffff3e0;
  int in_stack_fffffffffffff3f0;
  WARP_SEARCH_METHOD in_stack_fffffffffffff3f8;
  int in_stack_fffffffffffff400;
  int local_b50;
  int_interpfilters local_b4c;
  undefined1 local_b48 [64];
  undefined1 local_b08 [64];
  int local_ac8;
  uint local_ac4;
  undefined4 local_ac0;
  byte local_ab9;
  int local_ab8;
  uint local_ab4;
  MB_MODE_INFO local_ab0;
  undefined1 local_9d0 [176];
  uint local_920;
  byte local_91a;
  MV_REFERENCE_FRAME local_919;
  uint *local_918;
  uint *local_910;
  uint *local_908;
  uint local_900;
  int local_8fc;
  undefined1 local_8f8 [500];
  int in_stack_fffffffffffff8fc;
  int *in_stack_fffffffffffff900;
  int in_stack_fffffffffffff908;
  BLOCK_SIZE in_stack_fffffffffffff90f;
  MACROBLOCK *in_stack_fffffffffffff910;
  AV1_COMP *in_stack_fffffffffffff918;
  inter_mode_info *in_stack_fffffffffffff930;
  int_mv *in_stack_fffffffffffff938;
  HandleInterModeArgs *in_stack_fffffffffffff940;
  undefined1 local_4f8 [1024];
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  RD_STATS local_a8;
  uint local_80;
  int local_7c;
  byte local_75;
  int local_74;
  TileDataEnc *local_70;
  MACROBLOCKD *local_68;
  int local_5c;
  uint8_t *local_58;
  FeatureFlags *local_50;
  AV1_COMP *local_48;
  int *local_40;
  RD_STATS *local_38;
  BLOCK_SIZE local_29;
  long local_28;
  AV1_COMP *local_18;
  uint8_t *local_10;
  
  local_48 = (AV1_COMP *)&in_RDI->common;
  local_50 = &(in_RDI->common).features;
  local_58 = (uint8_t *)(in_RDX + 0x24e08);
  local_40 = in_R9;
  local_38 = in_R8;
  local_29 = in_CL;
  local_28 = in_RDX;
  local_18 = in_RDI;
  local_5c = av1_num_planes((AV1_COMMON *)local_48);
  local_68 = (MACROBLOCKD *)(local_28 + 0x1a0);
  local_70 = (TileDataEnc *)**(undefined8 **)(local_28 + 0x2058);
  local_74 = has_second_ref((MB_MODE_INFO *)local_70);
  local_75 = *(PREDICTION_MODE *)((long)&(local_70->tile_info).mi_row_start + 2);
  local_7c = local_38->rate;
  local_80 = 0;
  local_8fc = *in_stack_00000028;
  in_stack_fffffffffffff344 = in_stack_fffffffffffff344 & 0xffffff;
  uVar19 = in_stack_fffffffffffff344;
  if (*(char *)(*(long *)((local_48->enc_quant_dequant_params).quants.v_quant_fp[7] + 4) + 0x3e) !=
      '\0') {
    iVar9 = is_interintra_allowed
                      ((MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0)
                      );
    uVar19 = in_stack_fffffffffffff344 & 0xffffff;
    if (iVar9 != 0) {
      uVar19 = CONCAT13(((byte)((ushort)*(undefined2 *)
                                         ((long)(local_70->tctx).txb_skip_cdf[1][9] + 3) >> 9) & 1)
                        != 0,(int3)in_stack_fffffffffffff344);
    }
  }
  local_900 = uVar19 >> 0x18;
  local_908 = (uint *)(local_28 + 0x15de0 + (long)(char)(local_70->tile_info).tile_row * 0x84);
  local_910 = local_908 + 1;
  local_918 = local_908 + 0x11;
  local_919 = *(MV_REFERENCE_FRAME *)((long)&(local_70->tile_info).tile_row + 1);
  av1_invalid_rd_stats(&local_a8);
  local_70->field_0x19 = '\x01';
  local_91a = 0;
  *in_stack_00000058 = 0x7fffffffffffffff;
  if ((local_50->switchable_motion_mode & 1U) != 0) {
    local_91a = motion_mode_allowed((WarpedMotionParams *)
                                    CONCAT44(in_stack_fffffffffffff2ac,
                                             in_stack_fffffffffffff2a8.as_int),
                                    (MACROBLOCKD *)
                                    CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0),
                                    (MB_MODE_INFO *)
                                    CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),0)
    ;
  }
  if (local_91a == 2) {
    if ((int)*local_908 < 0) {
      bVar6 = av1_findSamples(in_stack_fffffffffffff378,in_stack_fffffffffffff370,
                              (int *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                              (int *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360));
      *local_908 = (uint)bVar6;
    }
    local_70->field_0x19 = (uint8_t)*local_908;
  }
  local_920 = (uint)(byte)local_70->field_0x19;
  if (local_920 == 0) {
    local_91a = 1;
  }
  memcpy(local_9d0,local_70,0xb0);
  local_ab0.wm_params.wmmat[4] = (int32_t)local_50->interp_filter;
  iVar9 = av1_is_interp_needed
                    ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298));
  if (iVar9 == 0) {
    iVar9 = 0;
  }
  else {
    iVar9 = av1_get_switchable_rate
                      ((MACROBLOCK *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                       (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
                       (InterpFilter)((uint)in_stack_fffffffffffff2ac >> 0x18),
                       in_stack_fffffffffffff2a8.as_int);
  }
  local_ab0.wm_params.wmmat[1] = -1;
  local_ab0.wm_params.wmmat[2] = 0x7fffffff;
  local_ab0.wm_params.wmmat[0] = local_8fc;
  local_ab0._24_4_ = local_68->mi_row;
  local_ab0.interp_filters = (int_interpfilters)local_68->mi_col;
  local_ab0.wm_params.wmmat[3] = iVar9;
  local_ab0.mv[0].as_int =
       get_txfm_rd_gate_level
                 ((uint)*(byte *)(*(long *)((local_48->enc_quant_dequant_params).quants.v_quant_fp
                                            [7] + 4) + 0x3f),
                  (local_18->sf).inter_sf.txfm_rd_gate_level,local_29,'\x01',in_stack_00000050);
  iVar10 = in_stack_00000050;
  update_mode_start_end_index
            (local_18,(MB_MODE_INFO *)local_70,(int *)local_ab0.ref_frame,
             (int *)&local_ab0.mv[1].as_int,(uint)local_91a,local_900,in_stack_00000050);
  x_00 = (MACROBLOCK *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0);
  mbmi_00 = (MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0);
  skip_rd_00 = (int *)CONCAT44(in_stack_fffffffffffff29c,iVar10);
  local_ab0.current_qindex._0_1_ = local_ab0.ref_frame[0];
  local_ab0.current_qindex._1_1_ = local_ab0.ref_frame[1];
  local_ab0.current_qindex._2_2_ = local_ab0._18_2_;
  do {
    if ((int)local_ab0.mv[1].as_int < local_ab0.current_qindex) {
      *(MV_REFERENCE_FRAME *)((long)&(local_70->tile_info).tile_row + 1) = local_919;
      *in_stack_00000028 = local_ab0.wm_params.wmmat[0];
      if ((local_ab0.wm_params.wmmat._4_8_ == 0x7fffffffffffffff) ||
         (iVar9 = av1_check_newmv_joint_nonzero
                            (in_stack_fffffffffffff2c8,(MACROBLOCK *)in_stack_fffffffffffff2c0),
         iVar9 == 0)) {
        av1_invalid_rd_stats(local_38);
        puVar2 = in_stack_00000030->plane[0].eobs;
        ptVar3 = in_stack_00000030->plane[0].qcoeff;
        ptVar4 = in_stack_00000030->plane[0].coeff;
        dst.plane[1]._4_4_ = (int)((ulong)in_stack_00000030->plane[0].dqcoeff >> 0x20);
        dst.plane._0_12_ = *(undefined1 (*) [12])in_stack_00000030->plane;
        dst.plane[2]._0_4_ = (int)ptVar3;
        dst.plane[2]._4_4_ = (int)((ulong)ptVar3 >> 0x20);
        dst.stride[0] = (int)ptVar4;
        dst.stride[1] = (int)((ulong)ptVar4 >> 0x20);
        dst.stride[2] = (int)puVar2;
        dst._36_4_ = (int)((ulong)puVar2 >> 0x20);
        restore_dst_buf(local_68,dst,local_5c);
        local_10 = (uint8_t *)0x7fffffffffffffff;
      }
      else {
        memcpy(local_70,local_ab0.wm_params.wmmat + 5,0xb0);
        memcpy(local_38,&local_a8,0x28);
        memcpy(local_40,local_d0,0x28);
        if (1 < local_5c) {
          memcpy(in_stack_00000008,local_f8,0x28);
        }
        memcpy(local_58 + 1,local_4f8,(ulong)local_68->height * (ulong)local_68->width);
        memcpy(local_68->tx_type_map,local_8f8,
               (long)(int)((uint)local_68->height * (uint)local_68->width));
        *local_58 = (uint8_t)local_80;
        puVar2 = in_stack_00000030->plane[0].eobs;
        ptVar3 = in_stack_00000030->plane[0].qcoeff;
        ptVar4 = in_stack_00000030->plane[0].coeff;
        dst_00.plane[1]._4_4_ = (int)((ulong)in_stack_00000030->plane[0].dqcoeff >> 0x20);
        dst_00.plane._0_12_ = *(undefined1 (*) [12])in_stack_00000030->plane;
        dst_00.plane[2]._0_4_ = (int)ptVar3;
        dst_00.plane[2]._4_4_ = (int)((ulong)ptVar3 >> 0x20);
        dst_00.stride[0] = (int)ptVar4;
        dst_00.stride[1] = (int)((ulong)ptVar4 >> 0x20);
        dst_00.stride[2] = (int)puVar2;
        dst_00._36_4_ = (int)((ulong)puVar2 >> 0x20);
        restore_dst_buf(local_68,dst_00,local_5c);
        local_10 = (uint8_t *)0x0;
      }
      return (int64_t)local_10;
    }
    if ((*(int *)(in_stack_00000010 + 0x80) == 0) || (local_ab0.current_qindex == 0)) {
      local_ab0.bsize = (undefined1)local_7c;
      local_ab0.partition = local_7c._1_1_;
      local_ab0.mode = local_7c._2_1_;
      local_ab0.uv_mode = local_7c._3_1_;
      local_ab4 = (uint)((int)(uint)local_91a < local_ab0.current_qindex);
      local_ab8 = local_8fc;
      memcpy(local_70,local_9d0,0xb0);
      if (local_ab4 == 0) {
        local_70->field_0x18 = (char)local_ab0.current_qindex;
      }
      else {
        local_70->field_0x18 = 0;
      }
      local_ab9 = get_frame_update_type(&local_18->ppi->gf_group,(uint)local_18->gf_frame_index);
      pTVar5 = local_70;
      local_ac0 = 1;
      local_ac4 = (uint)((local_18->ppi->frame_probs).obmc_probs[local_ab9][local_29] <
                        (local_18->sf).inter_sf.prune_obmc_prob_thresh);
      if (((((local_18->oxcf).motion_mode_cfg.enable_obmc & 1U) != 0) && (local_ac4 == 0)) ||
         ((char)*(int *)&local_70->field_0x18 != '\x01')) {
        if (((char)*(int *)&local_70->field_0x18 != '\0') || (local_ab4 != 0)) {
          if ((char)*(int *)&local_70->field_0x18 == '\x01') {
            local_ac8 = (local_70->tile_info).mi_col_start;
            iVar10 = have_newmv_in_inter_mode(local_75);
            if (iVar10 != 0) {
              mbmi_00 = (MB_MODE_INFO *)&(local_70->tile_info).mi_col_start;
              uVar14 = 0;
              uVar17 = 0;
              in_stack_fffffffffffff2a8.as_int = 0;
              in_stack_fffffffffffff2ac = 0;
              av1_single_motion_search
                        (in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                         in_stack_fffffffffffff90f,in_stack_fffffffffffff908,
                         in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
                         in_stack_fffffffffffff930,in_stack_fffffffffffff938,
                         in_stack_fffffffffffff940);
              skip_rd_00 = (int *)CONCAT44(uVar17,uVar14);
              local_ab0._0_4_ = (local_7c - local_8fc) + local_ab8;
            }
            uVar14 = (undefined4)((ulong)skip_rd_00 >> 0x20);
            uVar17 = (undefined4)((ulong)mbmi_00 >> 0x20);
            if (((local_70->tile_info).mi_col_start != local_ac8) || (in_stack_00000050 != 0)) {
              in_stack_fffffffffffff320 = local_68;
              in_stack_fffffffffffff328 = local_ab0._24_4_;
              in_stack_fffffffffffff32c = local_ab0.interp_filters;
              in_stack_fffffffffffff330 = in_stack_00000030;
              in_stack_fffffffffffff33f = local_29;
              iVar10 = av1_num_planes((AV1_COMMON *)local_48);
              iVar10 = iVar10 + -1;
              uVar15 = 0;
              av1_enc_build_inter_predictor
                        ((AV1_COMMON *)in_stack_fffffffffffff2f0,
                         (MACROBLOCKD *)in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e4,
                         in_stack_fffffffffffff2e0,(BUFFER_SET *)in_stack_fffffffffffff2d8,
                         (BLOCK_SIZE)((uint)in_stack_fffffffffffff2d4 >> 0x18),
                         in_stack_fffffffffffff300,in_stack_fffffffffffff308.as_int);
              skip_rd_00 = (int *)CONCAT44(uVar14,uVar15);
              mbmi_00 = (MB_MODE_INFO *)CONCAT44(uVar17,iVar10);
            }
            av1_build_obmc_inter_prediction
                      ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0),
                       (MACROBLOCKD *)in_stack_fffffffffffff2d8,
                       (uint8_t **)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                       (int *)in_stack_fffffffffffff2c8,(uint8_t **)in_stack_fffffffffffff2c0,
                       (int *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
          }
          else if ((char)*(int *)&local_70->field_0x18 == '\x02') {
            local_70->field_0x18 = 2;
            *(undefined1 *)((local_70->tctx).txb_skip_cdf[0][4] + 2) = 3;
            IVar8 = av1_unswitchable_filter((InterpFilter)local_ab0.wm_params.wmmat[4]);
            local_b4c = av1_broadcast_interp_filter(IVar8);
            uVar14 = (undefined4)((ulong)mbmi_00 >> 0x20);
            (pTVar5->tile_info).tile_col = (int)local_b4c;
            memcpy(local_b08,local_910,(long)(int)(local_920 << 1) << 2);
            memcpy(local_b48,local_918,(long)(int)(local_920 << 1) << 2);
            if (1 < (byte)local_70->field_0x19) {
              uVar7 = av1_selectSamples((MV *)CONCAT44(in_stack_fffffffffffff2d4,
                                                       in_stack_fffffffffffff2d0),
                                        (int *)in_stack_fffffffffffff2c8,
                                        &in_stack_fffffffffffff2c0->num,in_stack_fffffffffffff2bc,
                                        (BLOCK_SIZE)((uint)in_stack_fffffffffffff2b8 >> 0x18));
              local_70->field_0x19 = uVar7;
            }
            skip_rd_00 = (int *)&local_70->field_0x1c;
            iVar10 = local_ab0._24_4_;
            in_stack_fffffffffffff2a8 = local_ab0.interp_filters;
            iVar11 = av1_find_projection(in_stack_fffffffffffff2d0,(int *)in_stack_fffffffffffff2c8,
                                         &in_stack_fffffffffffff2c0->num,
                                         (BLOCK_SIZE)((uint)in_stack_fffffffffffff2bc >> 0x18),
                                         in_stack_fffffffffffff2b8,(int)((ulong)x_00 >> 0x20),
                                         (WarpedMotionParams *)
                                         CONCAT44(in_stack_fffffffffffff2e4,
                                                  in_stack_fffffffffffff2e0),
                                         (int)in_stack_fffffffffffff2e8,
                                         (int)in_stack_fffffffffffff2f0);
            mbmi_00 = (MB_MODE_INFO *)CONCAT44(uVar14,iVar10);
            if (iVar11 != 0) goto LAB_002ed3af;
            iVar10 = have_newmv_in_inter_mode(local_75);
            uVar17 = (undefined4)((ulong)skip_rd_00 >> 0x20);
            if (iVar10 != 0) {
              local_b50 = (local_70->tile_info).mi_col_start;
              memcpy(&stack0xfffffffffffff48c,&local_70->field_0x1c,0x24);
              uVar17 = (undefined4)((ulong)skip_rd_00 >> 0x20);
              uVar1 = local_70->field_0x19;
              av1_get_ref_mv((MACROBLOCK *)
                             CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                             (int)((ulong)x_00 >> 0x20));
              av1_make_default_subpel_ms_params
                        ((SUBPEL_MOTION_SEARCH_PARAMS *)in_stack_fffffffffffff2f0,
                         in_stack_fffffffffffff2e8,
                         (MACROBLOCK *)CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0)
                         ,(BLOCK_SIZE)((ulong)in_stack_fffffffffffff2d8 >> 0x38),
                         (MV *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                         (int *)in_stack_fffffffffffff2c8);
              in_stack_fffffffffffff2a8 = (int_interpfilters)(local_18->sf).mv_sf.warp_search_iters;
              uVar13 = (uint)(local_18->sf).mv_sf.warp_search_method;
              uVar16 = local_920;
              av1_refine_warped_mv
                        (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                         (SUBPEL_MOTION_SEARCH_PARAMS *)
                         CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                         (BLOCK_SIZE)((ulong)in_stack_fffffffffffff3c8 >> 0x38),
                         in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,
                         in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,
                         in_stack_fffffffffffff400);
              if (local_b50 == (local_70->tile_info).mi_col_start) {
                (local_70->tile_info).mi_col_start = local_b50;
                memcpy(&local_70->field_0x1c,&stack0xfffffffffffff48c,0x24);
                local_70->field_0x19 = uVar1;
              }
              else {
                local_ab8 = av1_mv_bit_cost((MV *)x_00,
                                            (MV *)CONCAT44(in_stack_fffffffffffff2ac,
                                                           in_stack_fffffffffffff2a8.as_int),
                                            (int *)CONCAT44(uVar14,uVar13),
                                            (int **)CONCAT44(uVar17,uVar16),0);
                local_ab0._0_4_ = (local_7c - local_8fc) + local_ab8;
              }
            }
            in_stack_fffffffffffff2f0 = local_48;
            in_stack_fffffffffffff308 = local_ab0.interp_filters;
            iVar10 = av1_num_planes((AV1_COMMON *)local_48);
            iVar10 = iVar10 + -1;
            uVar15 = 0;
            av1_enc_build_inter_predictor
                      ((AV1_COMMON *)in_stack_fffffffffffff2f0,
                       (MACROBLOCKD *)in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e4,
                       in_stack_fffffffffffff2e0,(BUFFER_SET *)in_stack_fffffffffffff2d8,
                       (BLOCK_SIZE)((uint)in_stack_fffffffffffff2d4 >> 0x18),
                       in_stack_fffffffffffff300,in_stack_fffffffffffff308.as_int);
            mbmi_00 = (MB_MODE_INFO *)CONCAT44(uVar14,iVar10);
            skip_rd_00 = (int *)CONCAT44(uVar17,uVar15);
          }
          else if (local_ab4 != 0) {
            skip_rd_00 = &local_ab8;
            mbmi_00 = &local_ab0;
            in_stack_fffffffffffff2a8.as_int = (uint32_t)in_stack_00000030;
            in_stack_fffffffffffff2ac = (undefined4)((ulong)in_stack_00000030 >> 0x20);
            in_stack_fffffffffffff3d4 =
                 av1_handle_inter_intra_mode
                           ((AV1_COMP *)base_mbmi._16_8_,(MACROBLOCK *)base_mbmi.mv,
                            base_mbmi.current_qindex._3_1_,(MB_MODE_INFO *)best_mbmi._168_8_,
                            (HandleInterModeArgs *)best_mbmi._160_8_,best_mbmi.inter_tx_size._6_8_,
                            (int *)base_mbmi._88_8_,
                            (int *)base_mbmi.palette_mode_info.palette_colors._2_8_,
                            (BUFFER_SET *)base_mbmi.palette_mode_info.palette_colors._10_8_);
            if (in_stack_fffffffffffff3d4 < 0) goto LAB_002ed3af;
          }
        }
        iVar10 = av1_check_newmv_joint_nonzero
                           (in_stack_fffffffffffff2c8,(MACROBLOCK *)in_stack_fffffffffffff2c0);
        uVar14 = (undefined4)((ulong)skip_rd_00 >> 0x20);
        if (iVar10 != 0) {
          *local_58 = '\0';
          local_38->dist = 0;
          local_38->sse = 0;
          local_38->skip_txfm = '\x01';
          local_38->rate = local_ab0._0_4_;
          in_stack_fffffffffffff3c8 = (tran_low_t *)(local_28 + 0x4230);
          if ((char)*(int *)&local_70->field_0x18 != '\x02') {
            local_38->rate = local_ab0.wm_params.wmmat[3] + local_38->rate;
          }
          if (local_900 != 0) {
            local_38->rate =
                 *(int *)(local_28 + 0x8898 + (ulong)""[local_29] * 8 +
                         (long)(int)(uint)(*(char *)((long)&(local_70->tile_info).tile_row + 1) ==
                                          '\0') * 4) + local_38->rate;
          }
          if ((local_91a != 0) && (*(char *)((long)&(local_70->tile_info).tile_row + 1) != '\0')) {
            if (local_91a == 2) {
              local_38->rate =
                   *(int *)(local_28 + 0x8a08 + (ulong)local_29 * 0xc +
                           (ulong)(byte)*(int *)&local_70->field_0x18 * 4) + local_38->rate;
            }
            else {
              local_38->rate =
                   *(int *)(local_28 + 0x8b10 + (ulong)local_29 * 8 +
                           (ulong)(byte)*(int *)&local_70->field_0x18 * 4) + local_38->rate;
            }
          }
          in_stack_fffffffffffff3c0 = (int *)0x7fffffffffffffff;
          if (in_stack_00000040 == 0) {
            in_stack_fffffffffffff3b8 = (int *)0xffffffffffffffff;
            local_c50 = 0xffffffffffffffff;
            in_stack_fffffffffffff3ac.as_int = 0;
            in_stack_fffffffffffff3a0 = 0;
            if ((local_18->sf).inter_sf.inter_mode_rd_model_estimation == 1) {
              in_stack_fffffffffffff3b8 =
                   (int *)get_sse(in_stack_fffffffffffff2f0,(MACROBLOCK *)in_stack_fffffffffffff2e8,
                                  (int64_t *)
                                  CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0));
              get_est_rate_dist(in_stack_fffffffffffff2d8,
                                (BLOCK_SIZE)((uint)in_stack_fffffffffffff2d4 >> 0x18),
                                (int64_t)in_stack_fffffffffffff2c8,&in_stack_fffffffffffff2c0->num,
                                (int64_t *)
                                CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
            }
            else if (((local_18->sf).inter_sf.inter_mode_rd_model_estimation == 2) ||
                    ((local_18->sf).rt_sf.use_nonrd_pick_mode != 0)) {
              skip_rd_00 = (int *)&stack0xfffffffffffff3ac;
              mbmi_00 = (MB_MODE_INFO *)&stack0xfffffffffffff3a0;
              x_00 = (MACROBLOCK *)&stack0xfffffffffffff3b8;
              in_stack_fffffffffffff2a8.as_int = 0;
              in_stack_fffffffffffff2ac = 0;
              in_stack_fffffffffffff2b8 = 0;
              in_stack_fffffffffffff2bc = 0;
              in_stack_fffffffffffff2c0 = (InterModesInfo *)0x0;
              in_stack_fffffffffffff2c8 = (AV1_COMMON *)0x0;
              model_rd_for_sb_with_curvfit
                        ((AV1_COMP *)CONCAT44(uVar19,iVar9),in_stack_fffffffffffff33f,
                         in_stack_fffffffffffff330,
                         (MACROBLOCKD *)
                         CONCAT44(in_stack_fffffffffffff32c.as_int,in_stack_fffffffffffff328),
                         (int)((ulong)in_stack_fffffffffffff320 >> 0x20),
                         (int)in_stack_fffffffffffff320,
                         (int *)CONCAT44(in_stack_fffffffffffff354.as_int,in_stack_fffffffffffff350)
                         ,in_stack_fffffffffffff358,
                         (uint8_t *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                         (int64_t *)CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                         &in_stack_fffffffffffff370->mi_row,(int64_t *)in_stack_fffffffffffff378,
                         (int64_t *)in_stack_fffffffffffff380);
              local_c50 = (ulong)*(uint *)(local_28 + 0x25660 +
                                          (long)(*local_68->mi)->ref_frame[0] * 4);
            }
            lVar12 = ((long)(int)(local_38->rate + in_stack_fffffffffffff3ac.as_int) *
                      (long)*(int *)(local_28 + 0x4218) + 0x100 >> 9) +
                     in_stack_fffffffffffff3a0 * 0x80;
            if ((double)lVar12 * 0.8 <= (double)*in_stack_00000038) {
              iVar10 = local_38->rate;
              local_38->rate = in_stack_fffffffffffff3ac.as_int + local_38->rate;
              local_38->dist = in_stack_fffffffffffff3a0;
              local_38->rdcost = lVar12;
              if (local_38->rdcost < *in_stack_00000038) {
                *in_stack_00000038 = local_38->rdcost;
                if (local_ab0.mv[0].as_int == 0) {
                  in_stack_fffffffffffff2e8 = (AV1_COMP *)0x7fffffffffffffff;
                }
                else {
                  in_stack_fffffffffffff2e8 =
                       (AV1_COMP *)
                       (((long)iVar10 * (long)*(int *)(local_28 + 0x4218) + 0x100 >> 9) +
                       local_c50 * 0x800);
                }
                in_stack_00000020[1] = in_stack_fffffffffffff2e8;
              }
              uVar14 = SUB84(in_stack_00000008,0);
              uVar17 = (undefined4)((ulong)in_stack_00000008 >> 0x20);
              uVar15 = SUB84(local_70,0);
              uVar18 = (undefined4)((ulong)local_70 >> 0x20);
              if (*(char *)((long)&local_48->ppi + 1) == '\0') {
                if (local_74 == 0) {
                  inter_modes_info_push
                            (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc,(int64_t)x_00,
                             CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8.as_int),
                             (RD_STATS *)local_70,in_stack_00000008,
                             (RD_STATS *)
                             CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                             (MB_MODE_INFO *)in_stack_fffffffffffff2d8);
                  mbmi_00 = (MB_MODE_INFO *)CONCAT44(uVar18,uVar15);
                  skip_rd_00 = (int *)CONCAT44(uVar17,uVar14);
                }
              }
              else {
                inter_modes_info_push
                          (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc,(int64_t)x_00,
                           CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8.as_int),
                           (RD_STATS *)local_70,in_stack_00000008,
                           (RD_STATS *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0)
                           ,(MB_MODE_INFO *)in_stack_fffffffffffff2d8);
                mbmi_00 = (MB_MODE_INFO *)CONCAT44(uVar18,uVar15);
                skip_rd_00 = (int *)CONCAT44(uVar17,uVar14);
              }
              *(undefined1 *)((local_70->tctx).txb_skip_cdf[1][5] + 2) = 0;
LAB_002ed12e:
              if (((local_75 == 0xf) || (local_75 == 0x17)) &&
                 (iVar10 = is_nontrans_global_motion
                                     ((MACROBLOCKD *)
                                      CONCAT44(in_stack_fffffffffffff2ac,
                                               in_stack_fffffffffffff2a8.as_int),mbmi_00),
                 iVar10 != 0)) {
                in_stack_fffffffffffff2d8 = local_70;
                IVar8 = av1_unswitchable_filter((InterpFilter)local_ab0.wm_params.wmmat[4]);
                in_stack_fffffffffffff354 = av1_broadcast_interp_filter(IVar8);
                (in_stack_fffffffffffff2d8->tile_info).tile_col = (int)in_stack_fffffffffffff354;
              }
              lVar12 = ((long)local_38->rate * (long)*(int *)(local_28 + 0x4218) + 0x100 >> 9) +
                       local_38->dist * 0x80;
              if (local_ab0.current_qindex == 0) {
                *(long *)(*(long *)(in_stack_00000010 + 0x78) + (ulong)local_75 * 0xc0 +
                          (ulong)((byte)(*(ushort *)((long)(local_70->tctx).txb_skip_cdf[1][9] + 3)
                                        >> 4) & 3) * 0x40 +
                         (long)(char)(local_70->tile_info).tile_row * 8) = lVar12;
              }
              else if ((long)local_ab0.wm_params.wmmat._4_8_ <= lVar12) goto LAB_002ed3af;
              memcpy(local_ab0.wm_params.wmmat + 5,local_70,0xb0);
              local_ab0.wm_params.wmmat._4_8_ = lVar12;
              memcpy(&local_a8,local_38,0x28);
              memcpy(local_d0,local_40,0x28);
              local_ab0.wm_params.wmmat[0] = local_ab8;
              *in_stack_00000058 = (long)in_stack_fffffffffffff3c0;
              if (1 < local_5c) {
                memcpy(local_f8,in_stack_00000008,0x28);
              }
              memcpy(local_4f8,local_58 + 1,(ulong)local_68->height * (ulong)local_68->width);
              memcpy(local_8f8,local_68->tx_type_map,
                     (long)(int)((uint)local_68->height * (uint)local_68->width));
              local_80 = (uint)(byte)(local_70->tctx).txb_skip_cdf[1][5][2];
            }
            else {
              ((macroblockd_plane *)&(local_70->tile_info).tile_row)->field_0x1 = local_919;
            }
          }
          else {
            cpi_00 = (AV1_COMP *)0x7fffffffffffffff;
            in_stack_fffffffffffff380 = (MACROBLOCK *)0x7fffffffffffffff;
            if (local_ab0.mv[0].as_int != 0) {
              in_stack_fffffffffffff378 = (AV1_COMMON *)0x7fffffffffffffff;
              in_stack_fffffffffffff370 =
                   (MACROBLOCKD *)
                   get_sse(in_stack_fffffffffffff2f0,(MACROBLOCK *)in_stack_fffffffffffff2e8,
                           (int64_t *)CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0))
              ;
              cpi_00 = (AV1_COMP *)
                       (((long)local_38->rate * (long)*(int *)(local_28 + 0x4218) + 0x100 >> 9) +
                       (long)in_stack_fffffffffffff370 * 0x80);
              in_stack_fffffffffffff380 =
                   (MACROBLOCK *)
                   (((long)local_38->rate * (long)*(int *)(local_28 + 0x4218) + 0x100 >> 9) +
                   (long)in_stack_fffffffffffff378 * 0x800);
              in_stack_fffffffffffff36c =
                   check_txfm_eval(x_00,(BLOCK_SIZE)((uint)in_stack_fffffffffffff2ac >> 0x18),
                                   (int64_t)mbmi_00,(int64_t)skip_rd_00,0,0x2ecea4);
              uVar14 = (undefined4)((ulong)skip_rd_00 >> 0x20);
              if (in_stack_fffffffffffff36c == 0) goto LAB_002ed3af;
            }
            in_stack_fffffffffffff368 = local_38->rate;
            iVar10 = local_38->rate;
            uVar17 = SUB84(in_stack_00000018,0);
            residue_cost = (int)((ulong)in_stack_00000018 >> 0x20);
            iVar11 = av1_txfm_search(cpi_00,in_stack_fffffffffffff380,
                                     (BLOCK_SIZE)((ulong)in_stack_fffffffffffff378 >> 0x38),
                                     (RD_STATS *)in_stack_fffffffffffff370,
                                     (RD_STATS *)
                                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368),
                                     (RD_STATS *)
                                     CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                                     (int)in_stack_fffffffffffff3a0,
                                     CONCAT44(in_stack_fffffffffffff3ac.as_int,
                                              in_stack_fffffffffffff3a8.as_int));
            mbmi_00 = (MB_MODE_INFO *)CONCAT44(residue_cost,uVar17);
            skip_rd_00 = (int *)CONCAT44(uVar14,iVar10);
            if (iVar11 != 0) {
              in_stack_fffffffffffff364 = av1_get_skip_txfm_context(local_68);
              if (local_38->skip_txfm == '\0') {
                in_stack_fffffffffffff2e4 =
                     *local_40 + *(int *)(local_28 + 0x8c80 + (long)in_stack_fffffffffffff364 * 8);
              }
              else {
                in_stack_fffffffffffff2e4 =
                     *(int *)(local_28 + 0x8c84 + (long)in_stack_fffffffffffff364 * 8);
              }
              in_stack_fffffffffffff3c0 =
                   (int *)(((long)(in_stack_fffffffffffff2e4 + in_stack_fffffffffffff368) *
                            (long)*(int *)(local_28 + 0x4218) + 0x100 >> 9) +
                          *(long *)(local_40 + 2) * 0x80);
              in_stack_fffffffffffff358 =
                   (int64_t *)
                   (((long)local_38->rate * (long)*(int *)(local_28 + 0x4218) + 0x100 >> 9) +
                   local_38->dist * 0x80);
              if ((long)in_stack_fffffffffffff358 < (long)in_stack_00000018) {
                *in_stack_00000020 = cpi_00;
                in_stack_00000020[1] = in_stack_fffffffffffff380;
                in_stack_00000018 = in_stack_fffffffffffff358;
              }
              in_stack_fffffffffffff360 = in_stack_fffffffffffff2e4;
              if ((local_18->sf).inter_sf.inter_mode_rd_model_estimation == 1) {
                inter_mode_data_push
                          ((TileDataEnc *)in_stack_fffffffffffff2c0,
                           (BLOCK_SIZE)((uint)in_stack_fffffffffffff2bc >> 0x18),(int64_t)x_00,
                           CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8.as_int),
                           residue_cost);
              }
              mbmi_00 = (MB_MODE_INFO *)CONCAT44(residue_cost,uVar17);
              skip_rd_00 = (int *)CONCAT44(uVar14,iVar10);
              goto LAB_002ed12e;
            }
            if ((*local_40 == 0x7fffffff) && (local_ab0.current_qindex == 0)) {
              return (int64_t)(uint8_t *)0x7fffffffffffffff;
            }
          }
        }
      }
    }
LAB_002ed3af:
    local_ab0.current_qindex = local_ab0.current_qindex + 1;
  } while( true );
}

Assistant:

static int64_t motion_mode_rd(
    const AV1_COMP *const cpi, TileDataEnc *tile_data, MACROBLOCK *const x,
    BLOCK_SIZE bsize, RD_STATS *rd_stats, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats_uv, HandleInterModeArgs *const args, int64_t ref_best_rd,
    int64_t *ref_skip_rd, int *rate_mv, const BUFFER_SET *orig_dst,
    int64_t *best_est_rd, int do_tx_search, InterModesInfo *inter_modes_info,
    int eval_motion_mode, int64_t *yrd) {
  const AV1_COMMON *const cm = &cpi->common;
  const FeatureFlags *const features = &cm->features;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_comp_pred = has_second_ref(mbmi);
  const PREDICTION_MODE this_mode = mbmi->mode;
  const int rate2_nocoeff = rd_stats->rate;
  int best_xskip_txfm = 0;
  RD_STATS best_rd_stats, best_rd_stats_y, best_rd_stats_uv;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const int rate_mv0 = *rate_mv;
  const int interintra_allowed = cm->seq_params->enable_interintra_compound &&
                                 is_interintra_allowed(mbmi) &&
                                 mbmi->compound_idx;
  WARP_SAMPLE_INFO *const warp_sample_info =
      &x->warp_sample_info[mbmi->ref_frame[0]];
  int *pts0 = warp_sample_info->pts;
  int *pts_inref0 = warp_sample_info->pts_inref;

  assert(mbmi->ref_frame[1] != INTRA_FRAME);
  const MV_REFERENCE_FRAME ref_frame_1 = mbmi->ref_frame[1];
  av1_invalid_rd_stats(&best_rd_stats);
  mbmi->num_proj_ref = 1;  // assume num_proj_ref >=1
  MOTION_MODE last_motion_mode_allowed = SIMPLE_TRANSLATION;
  *yrd = INT64_MAX;
  if (features->switchable_motion_mode) {
    // Determine which motion modes to search if more than SIMPLE_TRANSLATION
    // is allowed.
    last_motion_mode_allowed = motion_mode_allowed(
        xd->global_motion, xd, mbmi, features->allow_warped_motion);
  }

  if (last_motion_mode_allowed == WARPED_CAUSAL) {
    // Collect projection samples used in least squares approximation of
    // the warped motion parameters if WARPED_CAUSAL is going to be searched.
    if (warp_sample_info->num < 0) {
      warp_sample_info->num = av1_findSamples(cm, xd, pts0, pts_inref0);
    }
    mbmi->num_proj_ref = warp_sample_info->num;
  }
  const int total_samples = mbmi->num_proj_ref;
  if (total_samples == 0) {
    // Do not search WARPED_CAUSAL if there are no samples to use to determine
    // warped parameters.
    last_motion_mode_allowed = OBMC_CAUSAL;
  }

  const MB_MODE_INFO base_mbmi = *mbmi;
  MB_MODE_INFO best_mbmi;
  const int interp_filter = features->interp_filter;
  const int switchable_rate =
      av1_is_interp_needed(xd)
          ? av1_get_switchable_rate(x, xd, interp_filter,
                                    cm->seq_params->enable_dual_filter)
          : 0;
  int64_t best_rd = INT64_MAX;
  int best_rate_mv = rate_mv0;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int mode_index_start, mode_index_end;
  const int txfm_rd_gate_level =
      get_txfm_rd_gate_level(cm->seq_params->enable_masked_compound,
                             cpi->sf.inter_sf.txfm_rd_gate_level, bsize,
                             TX_SEARCH_MOTION_MODE, eval_motion_mode);

  // Modify the start and end index according to speed features. For example,
  // if SIMPLE_TRANSLATION has already been searched according to
  // the motion_mode_for_winner_cand speed feature, update the mode_index_start
  // to avoid searching it again.
  update_mode_start_end_index(cpi, mbmi, &mode_index_start, &mode_index_end,
                              last_motion_mode_allowed, interintra_allowed,
                              eval_motion_mode);
  // Main function loop. This loops over all of the possible motion modes and
  // computes RD to determine the best one. This process includes computing
  // any necessary side information for the motion mode and performing the
  // transform search.
  for (int mode_index = mode_index_start; mode_index <= mode_index_end;
       mode_index++) {
    if (args->skip_motion_mode && mode_index) continue;
    int tmp_rate2 = rate2_nocoeff;
    const int is_interintra_mode = mode_index > (int)last_motion_mode_allowed;
    int tmp_rate_mv = rate_mv0;

    *mbmi = base_mbmi;
    if (is_interintra_mode) {
      // Only use SIMPLE_TRANSLATION for interintra
      mbmi->motion_mode = SIMPLE_TRANSLATION;
    } else {
      mbmi->motion_mode = (MOTION_MODE)mode_index;
      assert(mbmi->ref_frame[1] != INTRA_FRAME);
    }

    // Do not search OBMC if the probability of selecting it is below a
    // predetermined threshold for this update_type and block size.
    const FRAME_UPDATE_TYPE update_type =
        get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
    int use_actual_frame_probs = 1;
    int prune_obmc;
#if CONFIG_FPMT_TEST
    use_actual_frame_probs =
        (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 0 : 1;
    if (!use_actual_frame_probs) {
      prune_obmc = cpi->ppi->temp_frame_probs.obmc_probs[update_type][bsize] <
                   cpi->sf.inter_sf.prune_obmc_prob_thresh;
    }
#endif
    if (use_actual_frame_probs) {
      prune_obmc = cpi->ppi->frame_probs.obmc_probs[update_type][bsize] <
                   cpi->sf.inter_sf.prune_obmc_prob_thresh;
    }
    if ((!cpi->oxcf.motion_mode_cfg.enable_obmc || prune_obmc) &&
        mbmi->motion_mode == OBMC_CAUSAL)
      continue;

    if (mbmi->motion_mode == SIMPLE_TRANSLATION && !is_interintra_mode) {
      // SIMPLE_TRANSLATION mode: no need to recalculate.
      // The prediction is calculated before motion_mode_rd() is called in
      // handle_inter_mode()
    } else if (mbmi->motion_mode == OBMC_CAUSAL) {
      const uint32_t cur_mv = mbmi->mv[0].as_int;
      // OBMC_CAUSAL not allowed for compound prediction
      assert(!is_comp_pred);
      if (have_newmv_in_inter_mode(this_mode)) {
        av1_single_motion_search(cpi, x, bsize, 0, &tmp_rate_mv, INT_MAX, NULL,
                                 &mbmi->mv[0], NULL);
        tmp_rate2 = rate2_nocoeff - rate_mv0 + tmp_rate_mv;
      }
      if ((mbmi->mv[0].as_int != cur_mv) || eval_motion_mode) {
        // Build the predictor according to the current motion vector if it has
        // not already been built
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                      0, av1_num_planes(cm) - 1);
      }
      // Build the inter predictor by blending the predictor corresponding to
      // this MV, and the neighboring blocks using the OBMC model
      av1_build_obmc_inter_prediction(
          cm, xd, args->above_pred_buf, args->above_pred_stride,
          args->left_pred_buf, args->left_pred_stride);
#if !CONFIG_REALTIME_ONLY
    } else if (mbmi->motion_mode == WARPED_CAUSAL) {
      int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
      mbmi->motion_mode = WARPED_CAUSAL;
      mbmi->wm_params.wmtype = DEFAULT_WMTYPE;
      mbmi->interp_filters =
          av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));

      memcpy(pts, pts0, total_samples * 2 * sizeof(*pts0));
      memcpy(pts_inref, pts_inref0, total_samples * 2 * sizeof(*pts_inref0));
      // Select the samples according to motion vector difference
      if (mbmi->num_proj_ref > 1) {
        mbmi->num_proj_ref = av1_selectSamples(
            &mbmi->mv[0].as_mv, pts, pts_inref, mbmi->num_proj_ref, bsize);
      }

      // Compute the warped motion parameters with a least squares fit
      //  using the collected samples
      if (!av1_find_projection(mbmi->num_proj_ref, pts, pts_inref, bsize,
                               mbmi->mv[0].as_mv.row, mbmi->mv[0].as_mv.col,
                               &mbmi->wm_params, mi_row, mi_col)) {
        assert(!is_comp_pred);
        if (have_newmv_in_inter_mode(this_mode)) {
          // Refine MV for NEWMV mode
          const int_mv mv0 = mbmi->mv[0];
          const WarpedMotionParams wm_params0 = mbmi->wm_params;
          const int num_proj_ref0 = mbmi->num_proj_ref;

          const int_mv ref_mv = av1_get_ref_mv(x, 0);
          SUBPEL_MOTION_SEARCH_PARAMS ms_params;
          av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize,
                                            &ref_mv.as_mv, NULL);

          // Refine MV in a small range.
          av1_refine_warped_mv(xd, cm, &ms_params, bsize, pts0, pts_inref0,
                               total_samples, cpi->sf.mv_sf.warp_search_method,
                               cpi->sf.mv_sf.warp_search_iters);

          if (mv0.as_int != mbmi->mv[0].as_int) {
            // Keep the refined MV and WM parameters.
            tmp_rate_mv = av1_mv_bit_cost(
                &mbmi->mv[0].as_mv, &ref_mv.as_mv, x->mv_costs->nmv_joint_cost,
                x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
            tmp_rate2 = rate2_nocoeff - rate_mv0 + tmp_rate_mv;
          } else {
            // Restore the old MV and WM parameters.
            mbmi->mv[0] = mv0;
            mbmi->wm_params = wm_params0;
            mbmi->num_proj_ref = num_proj_ref0;
          }
        }

        // Build the warped predictor
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                      av1_num_planes(cm) - 1);
      } else {
        continue;
      }
#endif  // !CONFIG_REALTIME_ONLY
    } else if (is_interintra_mode) {
      const int ret =
          av1_handle_inter_intra_mode(cpi, x, bsize, mbmi, args, ref_best_rd,
                                      &tmp_rate_mv, &tmp_rate2, orig_dst);
      if (ret < 0) continue;
    }

    // If we are searching newmv and the mv is the same as refmv, skip the
    // current mode
    if (!av1_check_newmv_joint_nonzero(cm, x)) continue;

    // Update rd_stats for the current motion mode
    txfm_info->skip_txfm = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    rd_stats->skip_txfm = 1;
    rd_stats->rate = tmp_rate2;
    const ModeCosts *mode_costs = &x->mode_costs;
    if (mbmi->motion_mode != WARPED_CAUSAL) rd_stats->rate += switchable_rate;
    if (interintra_allowed) {
      rd_stats->rate +=
          mode_costs->interintra_cost[size_group_lookup[bsize]]
                                     [mbmi->ref_frame[1] == INTRA_FRAME];
    }
    if ((last_motion_mode_allowed > SIMPLE_TRANSLATION) &&
        (mbmi->ref_frame[1] != INTRA_FRAME)) {
      if (last_motion_mode_allowed == WARPED_CAUSAL) {
        rd_stats->rate +=
            mode_costs->motion_mode_cost[bsize][mbmi->motion_mode];
      } else {
        rd_stats->rate +=
            mode_costs->motion_mode_cost1[bsize][mbmi->motion_mode];
      }
    }

    int64_t this_yrd = INT64_MAX;

    if (!do_tx_search) {
      // Avoid doing a transform search here to speed up the overall mode
      // search. It will be done later in the mode search if the current
      // motion mode seems promising.
      int64_t curr_sse = -1;
      int64_t sse_y = -1;
      int est_residue_cost = 0;
      int64_t est_dist = 0;
      int64_t est_rd = 0;
      if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
        curr_sse = get_sse(cpi, x, &sse_y);
        const int has_est_rd = get_est_rate_dist(tile_data, bsize, curr_sse,
                                                 &est_residue_cost, &est_dist);
        (void)has_est_rd;
        assert(has_est_rd);
      } else if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 2 ||
                 cpi->sf.rt_sf.use_nonrd_pick_mode) {
        model_rd_sb_fn[MODELRD_TYPE_MOTION_MODE_RD](
            cpi, bsize, x, xd, 0, num_planes - 1, &est_residue_cost, &est_dist,
            NULL, &curr_sse, NULL, NULL, NULL);
        sse_y = x->pred_sse[xd->mi[0]->ref_frame[0]];
      }
      est_rd = RDCOST(x->rdmult, rd_stats->rate + est_residue_cost, est_dist);
      if (est_rd * 0.80 > *best_est_rd) {
        mbmi->ref_frame[1] = ref_frame_1;
        continue;
      }
      const int mode_rate = rd_stats->rate;
      rd_stats->rate += est_residue_cost;
      rd_stats->dist = est_dist;
      rd_stats->rdcost = est_rd;
      if (rd_stats->rdcost < *best_est_rd) {
        *best_est_rd = rd_stats->rdcost;
        assert(sse_y >= 0);
        ref_skip_rd[1] = txfm_rd_gate_level
                             ? RDCOST(x->rdmult, mode_rate, (sse_y << 4))
                             : INT64_MAX;
      }
      if (cm->current_frame.reference_mode == SINGLE_REFERENCE) {
        if (!is_comp_pred) {
          assert(curr_sse >= 0);
          inter_modes_info_push(inter_modes_info, mode_rate, curr_sse,
                                rd_stats->rdcost, rd_stats, rd_stats_y,
                                rd_stats_uv, mbmi);
        }
      } else {
        assert(curr_sse >= 0);
        inter_modes_info_push(inter_modes_info, mode_rate, curr_sse,
                              rd_stats->rdcost, rd_stats, rd_stats_y,
                              rd_stats_uv, mbmi);
      }
      mbmi->skip_txfm = 0;
    } else {
      // Perform full transform search
      int64_t skip_rd = INT64_MAX;
      int64_t skip_rdy = INT64_MAX;
      if (txfm_rd_gate_level) {
        // Check if the mode is good enough based on skip RD
        int64_t sse_y = INT64_MAX;
        int64_t curr_sse = get_sse(cpi, x, &sse_y);
        skip_rd = RDCOST(x->rdmult, rd_stats->rate, curr_sse);
        skip_rdy = RDCOST(x->rdmult, rd_stats->rate, (sse_y << 4));
        int eval_txfm = check_txfm_eval(x, bsize, ref_skip_rd[0], skip_rd,
                                        txfm_rd_gate_level, 0);
        if (!eval_txfm) continue;
      }

      // Do transform search
      const int mode_rate = rd_stats->rate;
      if (!av1_txfm_search(cpi, x, bsize, rd_stats, rd_stats_y, rd_stats_uv,
                           rd_stats->rate, ref_best_rd)) {
        if (rd_stats_y->rate == INT_MAX && mode_index == 0) {
          return INT64_MAX;
        }
        continue;
      }
      const int skip_ctx = av1_get_skip_txfm_context(xd);
      const int y_rate =
          rd_stats->skip_txfm
              ? x->mode_costs.skip_txfm_cost[skip_ctx][1]
              : (rd_stats_y->rate + x->mode_costs.skip_txfm_cost[skip_ctx][0]);
      this_yrd = RDCOST(x->rdmult, y_rate + mode_rate, rd_stats_y->dist);

      const int64_t curr_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
      if (curr_rd < ref_best_rd) {
        ref_best_rd = curr_rd;
        ref_skip_rd[0] = skip_rd;
        ref_skip_rd[1] = skip_rdy;
      }
      if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
        inter_mode_data_push(
            tile_data, mbmi->bsize, rd_stats->sse, rd_stats->dist,
            rd_stats_y->rate + rd_stats_uv->rate +
                mode_costs->skip_txfm_cost[skip_ctx][mbmi->skip_txfm]);
      }
    }

    if (this_mode == GLOBALMV || this_mode == GLOBAL_GLOBALMV) {
      if (is_nontrans_global_motion(xd, xd->mi[0])) {
        mbmi->interp_filters =
            av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));
      }
    }

    const int64_t tmp_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
    if (mode_index == 0) {
      args->simple_rd[this_mode][mbmi->ref_mv_idx][mbmi->ref_frame[0]] = tmp_rd;
    }
    if (mode_index == 0 || tmp_rd < best_rd) {
      // Update best_rd data if this is the best motion mode so far
      best_mbmi = *mbmi;
      best_rd = tmp_rd;
      best_rd_stats = *rd_stats;
      best_rd_stats_y = *rd_stats_y;
      best_rate_mv = tmp_rate_mv;
      *yrd = this_yrd;
      if (num_planes > 1) best_rd_stats_uv = *rd_stats_uv;
      memcpy(best_blk_skip, txfm_info->blk_skip,
             sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
      av1_copy_array(best_tx_type_map, xd->tx_type_map, xd->height * xd->width);
      best_xskip_txfm = mbmi->skip_txfm;
    }
  }
  // Update RD and mbmi stats for selected motion mode
  mbmi->ref_frame[1] = ref_frame_1;
  *rate_mv = best_rate_mv;
  if (best_rd == INT64_MAX || !av1_check_newmv_joint_nonzero(cm, x)) {
    av1_invalid_rd_stats(rd_stats);
    restore_dst_buf(xd, *orig_dst, num_planes);
    return INT64_MAX;
  }
  *mbmi = best_mbmi;
  *rd_stats = best_rd_stats;
  *rd_stats_y = best_rd_stats_y;
  if (num_planes > 1) *rd_stats_uv = best_rd_stats_uv;
  memcpy(txfm_info->blk_skip, best_blk_skip,
         sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
  av1_copy_array(xd->tx_type_map, best_tx_type_map, xd->height * xd->width);
  txfm_info->skip_txfm = best_xskip_txfm;

  restore_dst_buf(xd, *orig_dst, num_planes);
  return 0;
}